

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uscript.cpp
# Opt level: O0

int32_t uscript_getCode_63(char *nameOrAbbrOrLocale,UScriptCode *fillIn,int32_t capacity,
                          UErrorCode *err)

{
  bool bVar1;
  UBool UVar2;
  UScriptCode UVar3;
  int32_t iVar4;
  char *pcVar5;
  UScriptCode code_1;
  UScriptCode code;
  int32_t length;
  UErrorCode internalErrorCode;
  char likely [157];
  UBool triedCode;
  UErrorCode *err_local;
  int32_t capacity_local;
  UScriptCode *fillIn_local;
  char *nameOrAbbrOrLocale_local;
  
  UVar2 = U_FAILURE(*err);
  if (UVar2 != '\0') {
    return 0;
  }
  if (nameOrAbbrOrLocale == (char *)0x0) {
LAB_00496191:
    *err = U_ILLEGAL_ARGUMENT_ERROR;
    nameOrAbbrOrLocale_local._4_4_ = 0;
  }
  else {
    if (fillIn == (UScriptCode *)0x0) {
      if (capacity != 0) goto LAB_00496191;
    }
    else if (capacity < 0) goto LAB_00496191;
    bVar1 = false;
    pcVar5 = strchr(nameOrAbbrOrLocale,0x2d);
    if ((pcVar5 == (char *)0x0) && (pcVar5 = strchr(nameOrAbbrOrLocale,0x5f), pcVar5 == (char *)0x0)
       ) {
      UVar3 = u_getPropertyValueEnum_63(UCHAR_SCRIPT,nameOrAbbrOrLocale);
      if (UVar3 != USCRIPT_INVALID_CODE) {
        iVar4 = setOneCode(UVar3,fillIn,capacity,err);
        return iVar4;
      }
      bVar1 = true;
    }
    code = USCRIPT_COMMON;
    nameOrAbbrOrLocale_local._4_4_ = getCodesFromLocale(nameOrAbbrOrLocale,fillIn,capacity,err);
    UVar2 = U_FAILURE(*err);
    if ((UVar2 == '\0') && (nameOrAbbrOrLocale_local._4_4_ == 0)) {
      uloc_addLikelySubtags_63(nameOrAbbrOrLocale,(char *)&length,0x9d,&code);
      UVar2 = U_SUCCESS(code);
      if ((UVar2 != '\0') && (code != ~USCRIPT_PSALTER_PAHLAVI)) {
        iVar4 = getCodesFromLocale((char *)&length,fillIn,capacity,err);
        UVar2 = U_FAILURE(*err);
        if (UVar2 != '\0') {
          return iVar4;
        }
        if (iVar4 != 0) {
          return iVar4;
        }
      }
      if ((bVar1) ||
         (UVar3 = u_getPropertyValueEnum_63(UCHAR_SCRIPT,nameOrAbbrOrLocale),
         UVar3 == USCRIPT_INVALID_CODE)) {
        nameOrAbbrOrLocale_local._4_4_ = 0;
      }
      else {
        nameOrAbbrOrLocale_local._4_4_ = setOneCode(UVar3,fillIn,capacity,err);
      }
    }
  }
  return nameOrAbbrOrLocale_local._4_4_;
}

Assistant:

U_CAPI int32_t  U_EXPORT2
uscript_getCode(const char* nameOrAbbrOrLocale,
                UScriptCode* fillIn,
                int32_t capacity,
                UErrorCode* err){
    UBool triedCode;
    char likely[ULOC_FULLNAME_CAPACITY];
    UErrorCode internalErrorCode;
    int32_t length;

    if(U_FAILURE(*err)) {
        return 0;
    }
    if(nameOrAbbrOrLocale==NULL ||
            (fillIn == NULL ? capacity != 0 : capacity < 0)) {
        *err = U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }

    triedCode = FALSE;
    if(uprv_strchr(nameOrAbbrOrLocale, '-')==NULL && uprv_strchr(nameOrAbbrOrLocale, '_')==NULL ){
        /* try long and abbreviated script names first */
        UScriptCode code = (UScriptCode) u_getPropertyValueEnum(UCHAR_SCRIPT, nameOrAbbrOrLocale);
        if(code!=USCRIPT_INVALID_CODE) {
            return setOneCode(code, fillIn, capacity, err);
        }
        triedCode = TRUE;
    }
    internalErrorCode = U_ZERO_ERROR;
    length = getCodesFromLocale(nameOrAbbrOrLocale, fillIn, capacity, err);
    if(U_FAILURE(*err) || length != 0) {
        return length;
    }
    (void)uloc_addLikelySubtags(nameOrAbbrOrLocale,
                                likely, UPRV_LENGTHOF(likely), &internalErrorCode);
    if(U_SUCCESS(internalErrorCode) && internalErrorCode != U_STRING_NOT_TERMINATED_WARNING) {
        length = getCodesFromLocale(likely, fillIn, capacity, err);
        if(U_FAILURE(*err) || length != 0) {
            return length;
        }
    }
    if(!triedCode) {
        /* still not found .. try long and abbreviated script names again */
        UScriptCode code = (UScriptCode) u_getPropertyValueEnum(UCHAR_SCRIPT, nameOrAbbrOrLocale);
        if(code!=USCRIPT_INVALID_CODE) {
            return setOneCode(code, fillIn, capacity, err);
        }
    }
    return 0;
}